

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_gethook(lua_State *L)

{
  lua_State *plVar1;
  int iVar2;
  lua_Hook p_Var3;
  char *s;
  lua_Hook hook;
  char local_2d;
  int mask;
  lua_State *plStack_28;
  char buff [5];
  lua_State *L1;
  lua_State *plStack_18;
  int arg;
  lua_State *L_local;
  
  plStack_18 = L;
  plStack_28 = getthread(L,(int *)((long)&L1 + 4));
  iVar2 = lua_gethookmask(plStack_28);
  p_Var3 = lua_gethook(plStack_28);
  if (p_Var3 == (lua_Hook)0x0) {
    lua_pushnil(plStack_18);
    L_local._4_4_ = 1;
  }
  else {
    if (p_Var3 == hookf) {
      lua_getfield(plStack_18,-0xf4628,"_HOOKKEY");
      checkstack(plStack_18,plStack_28,1);
      lua_pushthread(plStack_28);
      lua_xmove(plStack_28,plStack_18,1);
      lua_rawget(plStack_18,-2);
      lua_rotate(plStack_18,-2,-1);
      lua_settop(plStack_18,-2);
    }
    else {
      lua_pushstring(plStack_18,"external hook");
    }
    plVar1 = plStack_18;
    s = unmakemask(iVar2,&local_2d);
    lua_pushstring(plVar1,s);
    plVar1 = plStack_18;
    iVar2 = lua_gethookcount(plStack_28);
    lua_pushinteger(plVar1,(long)iVar2);
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

static int db_gethook (lua_State *L) {
  int arg;
  lua_State *L1 = getthread(L, &arg);
  char buff[5];
  int mask = lua_gethookmask(L1);
  lua_Hook hook = lua_gethook(L1);
  if (hook == NULL) {  /* no hook? */
    luaL_pushfail(L);
    return 1;
  }
  else if (hook != hookf)  /* external hook? */
    lua_pushliteral(L, "external hook");
  else {  /* hook table must exist */
    lua_getfield(L, LUA_REGISTRYINDEX, HOOKKEY);
    checkstack(L, L1, 1);
    lua_pushthread(L1); lua_xmove(L1, L, 1);
    lua_rawget(L, -2);   /* 1st result = hooktable[L1] */
    lua_remove(L, -2);  /* remove hook table */
  }
  lua_pushstring(L, unmakemask(mask, buff));  /* 2nd result = mask */
  lua_pushinteger(L, lua_gethookcount(L1));  /* 3rd result = count */
  return 3;
}